

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O3

RDL_URFinfo * RDL_initUrfInfo(RDL_cfURF *RCFs,RDL_graph *graph)

{
  RDL_cfam **ppRVar1;
  RDL_cfam **ppRVar2;
  bool bVar3;
  RDL_URFinfo *pRVar4;
  ulong uVar5;
  uint *__s;
  char ***pppcVar6;
  char **ppcVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  size_t __size;
  uint uVar14;
  ulong local_40;
  
  pRVar4 = (RDL_URFinfo *)malloc(0x30);
  ppRVar2 = RCFs->fams;
  uVar14 = (*ppRVar2)->weight;
  uVar11 = (ulong)RCFs->nofFams;
  if (uVar11 == 0) {
    __size = 4;
    __s = (uint *)malloc(4);
    uVar12 = 1;
    local_40 = 1;
  }
  else {
    uVar12 = 1;
    uVar5 = 0;
    uVar9 = uVar14;
    do {
      ppRVar1 = ppRVar2 + uVar5;
      uVar12 = uVar12 + ((*ppRVar1)->weight != uVar9);
      uVar5 = uVar5 + 1;
      uVar9 = (*ppRVar1)->weight;
    } while (uVar11 != uVar5);
    local_40 = (ulong)uVar12;
    __size = local_40 * 4;
    __s = (uint *)malloc(__size);
    if (uVar12 == 0) {
      local_40 = 0;
      bVar3 = true;
      uVar12 = 0;
      goto LAB_001092a3;
    }
  }
  bVar3 = false;
  memset(__s,0,__size);
LAB_001092a3:
  if (uVar11 != 0) {
    uVar5 = 0;
    uVar10 = 0;
    do {
      uVar9 = ppRVar2[uVar5]->weight;
      uVar10 = (ulong)((int)uVar10 + (uint)(uVar9 != uVar14));
      __s[uVar10] = __s[uVar10] + 1;
      uVar5 = uVar5 + 1;
      uVar14 = uVar9;
    } while (uVar11 != uVar5);
  }
  pppcVar6 = (char ***)malloc(local_40 * 8);
  if (!bVar3) {
    uVar11 = 0;
    do {
      uVar14 = __s[uVar11];
      uVar5 = (ulong)uVar14;
      ppcVar7 = (char **)malloc(uVar5 * 8);
      pppcVar6[uVar11] = ppcVar7;
      pcVar8 = (char *)malloc((ulong)(uVar14 * uVar14));
      *ppcVar7 = pcVar8;
      if (1 < uVar5) {
        uVar10 = 1;
        do {
          pcVar8 = pcVar8 + uVar5;
          ppcVar7[uVar10] = pcVar8;
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_40);
    uVar11 = 0;
    do {
      uVar5 = (ulong)__s[uVar11];
      if (uVar5 != 0) {
        uVar10 = 0;
        do {
          ppcVar7 = pppcVar6[uVar11];
          uVar13 = 0;
          do {
            ppcVar7[uVar10][uVar13] = '\0';
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar5);
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar5);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_40);
  }
  pRVar4->nofWeights = uVar12;
  pRVar4->nofProtos = __s;
  pRVar4->URFrel = pppcVar6;
  return pRVar4;
}

Assistant:

RDL_URFinfo *RDL_initUrfInfo(RDL_cfURF *RCFs, RDL_graph *graph)
{
  RDL_URFinfo *urfInfo;
  char ***URFrel;
  unsigned numOfWeights = 1;
  unsigned *numOfProtos;
  unsigned i, j, k, currWeight, currIdx;
  urfInfo = malloc(sizeof(*urfInfo));

  /* count number of different weights occuring*/
  currWeight = RCFs->fams[0]->weight;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++numOfWeights;
      currWeight = RCFs->fams[i]->weight;
    }
  }

  /* for each weight count number of different prototypes */
  numOfProtos = malloc(numOfWeights * sizeof(*numOfProtos));
  for(i=0; i<numOfWeights; ++i)
  {
    numOfProtos[i] = 0;
  }
  currWeight = RCFs->fams[0]->weight;
  currIdx = 0;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++currIdx;
      currWeight = RCFs->fams[i]->weight;
    }
    ++numOfProtos[currIdx];
  }

   /*allocate everything*/
  URFrel = malloc(numOfWeights * sizeof(*URFrel));
  for(i=0; i<numOfWeights; ++i)
  {
    URFrel[i] = malloc(numOfProtos[i] * sizeof(*URFrel[i]));
    *URFrel[i] = malloc(numOfProtos[i] * numOfProtos[i] * sizeof(**URFrel[i]));
    for(j=1; j<numOfProtos[i]; ++j)
    {
      URFrel[i][j] = URFrel[i][j-1] + numOfProtos[i];
    }
  }

  /*initialize with zeros*/
  for(i=0; i<numOfWeights; ++i)
  {
    for(j=0; j<numOfProtos[i]; ++j)
    {
      for(k=0; k<numOfProtos[i]; ++k)
      {
        URFrel[i][j][k] = 0;
      }
    }
  }

  urfInfo->nofWeights = numOfWeights;
  urfInfo->nofProtos = numOfProtos;
  urfInfo->URFrel = URFrel;

  return urfInfo;
}